

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createQuadPlane
          (SceneGraph *this,Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  size_t sVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pvVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  QuadMeshNode *this_00;
  Vec3fa *pVVar13;
  int iVar14;
  long lVar15;
  size_t sVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *this_01;
  float fVar26;
  float fVar27;
  Ref<embree::SceneGraph::MaterialNode> local_58;
  long local_50;
  Node *local_48;
  ulong local_40;
  Vec3fa *local_38;
  
  local_48 = (Node *)this;
  this_00 = (QuadMeshNode *)operator_new(0xd8);
  local_58 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  QuadMeshNode::QuadMeshNode(this_00,&local_58,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_58.ptr != (MaterialNode *)0x0) {
    (*((local_58.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar17 = width + 1;
  local_50 = height + 1;
  uVar20 = local_50 * lVar17;
  uVar18 = pvVar4->size_alloced;
  uVar24 = uVar18;
  if ((uVar18 < uVar20) && (uVar24 = uVar20, uVar23 = uVar18, uVar18 != 0)) {
    do {
      uVar24 = uVar23 * 2 + (ulong)(uVar23 * 2 == 0);
      uVar23 = uVar24;
    } while (uVar24 < uVar20);
  }
  if (uVar20 < pvVar4->size_active) {
    pvVar4->size_active = uVar20;
  }
  if (uVar18 == uVar24) {
    pvVar4->size_active = uVar20;
  }
  else {
    local_38 = pvVar4->items;
    local_40 = uVar24;
    pVVar13 = (Vec3fa *)alignedMalloc(uVar24 << 4,0x10);
    pvVar4->items = pVVar13;
    if (pvVar4->size_active != 0) {
      lVar15 = 0;
      uVar18 = 0;
      do {
        puVar2 = (undefined8 *)((long)&local_38->field_0 + lVar15);
        uVar12 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar15);
        *puVar3 = *puVar2;
        puVar3[1] = uVar12;
        uVar18 = uVar18 + 1;
        lVar15 = lVar15 + 0x10;
      } while (uVar18 < pvVar4->size_active);
    }
    alignedFree(local_38);
    pvVar4->size_active = uVar20;
    pvVar4->size_alloced = local_40;
  }
  this_01 = &this_00->quads;
  std::
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  ::resize(this_01,height * width);
  lVar15 = 0;
  uVar18 = 0;
  do {
    fVar26 = (float)uVar18 / (float)height;
    uVar24 = 0;
    lVar21 = lVar15;
    do {
      fVar27 = (float)uVar24 / (float)width;
      fVar6 = (dx->field_0).m128[1];
      fVar7 = (dx->field_0).m128[2];
      fVar8 = (p0->field_0).m128[1];
      fVar9 = (p0->field_0).m128[2];
      fVar10 = (dy->field_0).m128[1];
      fVar11 = (dy->field_0).m128[2];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar21) =
           (dy->field_0).m128[0] * fVar26 + fVar27 * (dx->field_0).m128[0] + (p0->field_0).m128[0];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar21 + 4) =
           fVar10 * fVar26 + fVar27 * fVar6 + fVar8;
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar21 + 8) =
           fVar11 * fVar26 + fVar27 * fVar7 + fVar9;
      uVar24 = uVar24 + 1;
      lVar21 = lVar21 + 0x10;
    } while (lVar17 + (ulong)(lVar17 == 0) != uVar24);
    uVar18 = uVar18 + 1;
    lVar15 = lVar15 + width * 0x10 + 0x10;
  } while (uVar18 != local_50 + (ulong)(local_50 == 0));
  if (height != 0) {
    iVar14 = (int)width + 1;
    sVar16 = 0;
    do {
      if (width != 0) {
        iVar19 = ((int)sVar16 + 1) * iVar14;
        iVar22 = (int)sVar16 * iVar14;
        lVar17 = sVar16 * width * 0x10;
        sVar25 = 0;
        do {
          sVar1 = sVar25 + 1;
          iVar5 = (int)sVar25;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v0 + lVar17) =
               iVar22 + iVar5;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v1 + lVar17) =
               iVar22 + iVar5 + 1;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v2 + lVar17) =
               iVar19 + iVar5 + 1;
          *(int *)((long)&((this_01->
                           super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                           )._M_impl.super__Vector_impl_data._M_start)->v3 + lVar17) =
               iVar5 + iVar19;
          lVar17 = lVar17 + 0x10;
          sVar25 = sVar1;
        } while (width != sVar1);
      }
      sVar16 = sVar16 + 1;
    } while (sVar16 != height);
  }
  (local_48->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_48;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createQuadPlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->quads.resize(width*height);

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    for (size_t y=0; y<height; y++) {
      for (size_t x=0; x<width; x++) {
        size_t i = y*width+x;
        size_t p00 = (y+0)*(width+1)+(x+0);
        size_t p01 = (y+0)*(width+1)+(x+1);
        size_t p10 = (y+1)*(width+1)+(x+0);
        size_t p11 = (y+1)*(width+1)+(x+1);
        mesh->quads[i].v0 = unsigned(p00); 
        mesh->quads[i].v1 = unsigned(p01); 
        mesh->quads[i].v2 = unsigned(p11); 
        mesh->quads[i].v3 = unsigned(p10);
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }